

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O2

bool_t zzIsSumEq_fast(word *c,word *a,word *b,size_t n)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  sVar2 = 0;
  do {
    if (n == sVar2) {
      return (bool_t)(uVar3 == 0);
    }
    uVar1 = c[sVar2];
    uVar4 = a[sVar2] + uVar3;
    if (CARRY8(a[sVar2],uVar3)) {
      if (uVar1 != b[sVar2]) {
        return 0;
      }
    }
    else {
      if (uVar1 != b[sVar2] + uVar4) {
        return 0;
      }
      uVar3 = (ulong)(uVar1 < uVar4);
    }
    sVar2 = sVar2 + 1;
  } while( true );
}

Assistant:

bool_t FAST(zzIsSumEq)(const word c[], const word a[], const word b[], 
	size_t n)
{
	register word carry = 0;
	register word w;
	size_t i;
	ASSERT(wwIsValid(a, n));
	ASSERT(wwIsValid(b, n));
	ASSERT(wwIsValid(c, n));
	for (i = 0; i < n; ++i)
	{
		w = a[i] + carry;
		if (w < carry)
			if (c[i] != b[i])
				return FALSE;
			else
				continue;
		if (c[i] != (word)(w + b[i]))
			return FALSE;
		carry = c[i] < w;
	}
	w = 0;
	return carry == 0;
}